

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O1

void __thiscall
cs::stack_type<std::function<bool_(void_*)>,_std::allocator>::destroy
          (stack_type<std::function<bool_(void_*)>,_std::allocator> *this)

{
  _Any_data *p_Var1;
  _Manager_type p_Var2;
  function<bool_(void_*)> *pfVar3;
  
  pfVar3 = this->m_current;
  if (pfVar3 != this->m_start) {
    do {
      p_Var1 = (_Any_data *)(pfVar3 + -1);
      this->m_current = (function<bool_(void_*)> *)p_Var1;
      p_Var2 = pfVar3[-1].super__Function_base._M_manager;
      if (p_Var2 != (_Manager_type)0x0) {
        (*p_Var2)(p_Var1,p_Var1,__destroy_functor);
      }
      pfVar3 = this->m_current;
    } while (pfVar3 != this->m_start);
  }
  operator_delete(this->m_data,this->m_size << 5);
  return;
}

Assistant:

void destroy()
		{
			while (m_current != m_start)
				(--m_current)->~T();
			m_alloc.deallocate(m_data, m_size);
		}